

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_maze.cpp
# Opt level: O0

int random_maze(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *maze,int N)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int max1;
  int i;
  int N_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *maze_local;
  
  for (j = 0; j < N; j = j + 1) {
    local_1c = 0;
    for (local_20 = 0; local_20 < N; local_20 = local_20 + 1) {
      if (N / 2 < local_1c) {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](maze,(long)j);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_20);
        *pvVar3 = 0;
      }
      else {
        iVar1 = rand();
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](maze,(long)j);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_20);
        *pvVar3 = iVar1 % 2;
      }
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](maze,(long)j);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_20);
      if (*pvVar3 == 1) {
        local_1c = local_1c + 1;
      }
    }
  }
  return 1;
}

Assistant:

int random_maze(vector<vector<int>> &maze, int N)
{
	try
	{

		for (int i = 0; i < N; i++)
		{
			int max1 = 0;
			for (int j = 0; j < N; j++)
			{
				if (max1 <= N / 2)
					maze[i][j] = rand() % 2;
				else
					maze[i][j] = 0;

				if (maze[i][j] == 1)
					max1++;
			}
		}
		return 1;
	}
	catch (const std::exception &)
	{
		cerr << "maze init error";
		return -1;
	}
}